

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_cache.cpp
# Opt level: O0

void __thiscall libtorrent::aux::stat_cache::set_dirty(stat_cache *this,file_index_t i)

{
  bool bVar1;
  value_type *pvVar2;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_24;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  stat_cache *this_local;
  file_index_t i_local;
  
  l._M_device = &this->m_mutex;
  this_local._4_4_ = i.m_val;
  ::std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_mutex);
  local_24 = container_wrapper<libtorrent::aux::stat_cache::stat_cache_t,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>_>
             ::end_index(&this->m_stat_cache);
  bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>=
                    ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                     ((long)&this_local + 4),&local_24);
  if (!bVar1) {
    pvVar2 = container_wrapper<libtorrent::aux::stat_cache::stat_cache_t,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>_>
             ::operator[](&this->m_stat_cache,
                          (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                          this_local._4_4_);
    pvVar2->file_size = -1;
  }
  ::std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void stat_cache::set_dirty(file_index_t const i)
	{
		std::lock_guard<std::mutex> l(m_mutex);
		if (i >= m_stat_cache.end_index()) return;
		m_stat_cache[i].file_size = not_in_cache;
	}